

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O2

int Mvc_CoverGetCubeSize(Mvc_Cube_t *pCube)

{
  int iVar1;
  uint uVar2;
  Mvc_CubeWord_t *pMVar3;
  
  uVar2 = ((*(uint *)&pCube->field_0x8 & 0xffffff) * 0x20 -
          (*(uint *)&pCube->field_0x8 >> 0x18 & 0x3f)) + 0x20;
  iVar1 = 0;
  for (pMVar3 = pCube->pData;
      pMVar3 < (byte *)((long)pCube->pData +
                       (long)(int)(((int)((ulong)(long)(int)uVar2 >> 3) + 1) -
                                  (uint)((uVar2 & 7) == 0)));
      pMVar3 = (Mvc_CubeWord_t *)((long)pMVar3 + 1)) {
    iVar1 = iVar1 + bit_count[(byte)*pMVar3];
  }
  return iVar1;
}

Assistant:

int Mvc_CoverGetCubeSize( Mvc_Cube_t * pCube )
{
    unsigned char * pByte, * pByteStart, * pByteStop;
    int nOnes, nBytes, nBits;
    // get the number of unsigned chars in the cube's bit strings
    nBits = (pCube->iLast + 1) * sizeof(Mvc_CubeWord_t) * 8 - pCube->nUnused;
    nBytes = nBits / (8 * sizeof(unsigned char)) + (int)(nBits % (8 * sizeof(unsigned char)) > 0);
    // clean the counter of ones
    nOnes = 0;
    // set the starting and stopping positions
    pByteStart = (unsigned char *)pCube->pData;
    pByteStop  = pByteStart + nBytes;
    // iterate through the positions
    for ( pByte = pByteStart; pByte < pByteStop; pByte++ )
        nOnes += bit_count[*pByte];
    return nOnes;
}